

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void cconv_err_convtv(CTState *cts,CType *d,TValue *o,CTInfo flags)

{
  GCstr *pGVar1;
  uint local_3c;
  char *src;
  char *dst;
  CTInfo flags_local;
  TValue *o_local;
  CType *d_local;
  CTState *cts_local;
  
  pGVar1 = lj_ctype_repr(cts->L,(CTypeID)(((long)d - (long)cts->tab) / 0x18),(GCstr *)0x0);
  if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff3) {
    local_3c = 0xd;
  }
  else {
    local_3c = (int)(o->field_4).it >> 0xf ^ 0xffffffff;
  }
  if (flags >> 8 != 0) {
    lj_err_argv(cts->L,flags >> 8,LJ_ERR_FFI_BADCONV,lj_obj_itypename[local_3c],pGVar1 + 1);
  }
  lj_err_callerv(cts->L,LJ_ERR_FFI_BADCONV,lj_obj_itypename[local_3c],pGVar1 + 1);
}

Assistant:

LJ_NORET static void cconv_err_convtv(CTState *cts, CType *d, TValue *o,
				      CTInfo flags)
{
  const char *dst = strdata(lj_ctype_repr(cts->L, ctype_typeid(cts, d), NULL));
  const char *src = lj_typename(o);
  if (CCF_GETARG(flags))
    lj_err_argv(cts->L, CCF_GETARG(flags), LJ_ERR_FFI_BADCONV, src, dst);
  else
    lj_err_callerv(cts->L, LJ_ERR_FFI_BADCONV, src, dst);
}